

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O3

void test_options(void)

{
  size_t *psVar1;
  undefined1 auVar2 [8];
  bool p_convert_strings;
  bool bVar3;
  bool p_convert_strings_00;
  bool p_convert_strings_01;
  int iVar4;
  json *pjVar5;
  string *psVar6;
  ostream *poVar7;
  pointer *__ptr;
  char *pcVar8;
  undefined1 in_R10B;
  undefined1 local_2298 [8];
  undefined1 local_2290 [8];
  undefined1 local_2288 [8];
  parser p;
  ifstream f;
  ios_base local_21e0 [400];
  stream_reader r;
  
  std::ifstream::ifstream(&f,"test_files/test2.json",_S_in);
  argo::stream_reader::stream_reader(&r,(istream *)&f,100,true);
  argo::parser::parser(&p,&r.super_reader,true,0x19000,1000,true,(bool)in_R10B,p_convert_strings);
  argo::parser::parse((parser *)local_2298);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: message too long but parsed anyway\n",0x29);
  auVar2 = local_2298;
  if (local_2298 != (undefined1  [8])0x0) {
    argo::json::~json((json *)local_2298);
    operator_delete((void *)auVar2);
  }
  std::ifstream::~ifstream(&f);
  std::ifstream::ifstream(&f,"test_files/test6.json",_S_in);
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser(&p,&r.super_reader,false,0x19000,1000,true,(bool)in_R10B,true);
  argo::parser::parse((parser *)local_2298);
  pjVar5 = argo::json::operator[]((json *)local_2298,"one");
  bVar3 = argo::json::operator!=(pjVar5,1);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"FAIL: first message broken\n",0x1b);
  }
  argo::parser::parse((parser *)local_2288);
  pjVar5 = argo::json::operator[]((json *)local_2288,"two");
  bVar3 = argo::json::operator!=(pjVar5,2);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"FAIL: second message broken\n",0x1c);
  }
  argo::parser::parse((parser *)local_2290);
  pjVar5 = argo::json::operator[]((json *)local_2290,"three");
  bVar3 = argo::json::operator!=(pjVar5,3);
  if (bVar3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"FAIL: third message broken\n",0x1b);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"PASS: parsed three messages from file\n",0x26);
  if (local_2290 != (undefined1  [8])0x0) {
    argo::json::~json((json *)local_2290);
    operator_delete((void *)local_2290);
  }
  if (local_2288 != (undefined1  [8])0x0) {
    argo::json::~json((json *)local_2288);
    operator_delete((void *)local_2288);
  }
  auVar2 = local_2298;
  if (local_2298 != (undefined1  [8])0x0) {
    argo::json::~json((json *)local_2298);
    operator_delete((void *)auVar2);
  }
  std::ifstream::~ifstream(&f);
  psVar1 = &r.super_reader.m_byte_index;
  r.super_reader._vptr_reader = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&r,"99999999999999999999","");
  std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)&r,_S_in);
  if (r.super_reader._vptr_reader != (_func_int **)psVar1) {
    operator_delete(r.super_reader._vptr_reader);
  }
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser(&p,&r.super_reader,true,1000,1000,true,(bool)in_R10B,p_convert_strings_00);
  argo::parser::parse((parser *)local_2298);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,
             "FAIL: int that was too large to be an int didn\'t cause an exception\n",0x44);
  auVar2 = local_2298;
  if (local_2298 != (undefined1  [8])0x0) {
    argo::json::~json((json *)local_2298);
    operator_delete((void *)auVar2);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&f);
  std::ios_base::~ios_base(local_21e0);
  r.super_reader._vptr_reader = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&r,"99999999999999999999.99","");
  std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)&r,_S_in);
  if (r.super_reader._vptr_reader != (_func_int **)psVar1) {
    operator_delete(r.super_reader._vptr_reader);
  }
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser(&p,&r.super_reader,true,1000,1000,false,(bool)in_R10B,true);
  argo::parser::parse((parser *)local_2298);
  psVar6 = argo::json::get_raw_value_abi_cxx11_((json *)local_2298);
  iVar4 = std::__cxx11::string::compare((char *)psVar6);
  pcVar8 = "FAIL: don\'t convert number returned an incorrect raw value\n";
  if (iVar4 == 0) {
    pcVar8 = "PASS: don\'t convert number returned the correct raw value\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,pcVar8,(ulong)(iVar4 == 0) ^ 0x3b);
  auVar2 = local_2298;
  if (local_2298 != (undefined1  [8])0x0) {
    argo::json::~json((json *)local_2298);
    operator_delete((void *)auVar2);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&f);
  std::ios_base::~ios_base(local_21e0);
  r.super_reader._vptr_reader = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&r,"\" lkjlkj lkjlkj \\x \\y \"","");
  std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)&r,_S_in);
  if (r.super_reader._vptr_reader != (_func_int **)psVar1) {
    operator_delete(r.super_reader._vptr_reader);
  }
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser(&p,&r.super_reader,true,1000,1000,true,(bool)in_R10B,p_convert_strings_01);
  argo::parser::parse((parser *)local_2298);
  psVar6 = argo::json::get_raw_value_abi_cxx11_((json *)local_2298);
  iVar4 = std::__cxx11::string::compare((char *)psVar6);
  if (iVar4 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"PASS: don\'t convert string returned the correct raw value\n",0x3a)
    ;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&jlog,"FAIL: don\'t convert string returned an incorrect raw value:\'",
               0x3c);
    psVar6 = argo::json::get_raw_value_abi_cxx11_((json *)local_2298);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&jlog,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\'",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
  }
  auVar2 = local_2298;
  if (local_2298 != (undefined1  [8])0x0) {
    argo::json::~json((json *)local_2298);
    operator_delete((void *)auVar2);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&f);
  std::ios_base::~ios_base(local_21e0);
  r.super_reader._vptr_reader = (_func_int **)psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&r,"[[[[[[[[[[]]]]]]]]]]","");
  std::__cxx11::istringstream::istringstream((istringstream *)&f,(string *)&r,_S_in);
  if (r.super_reader._vptr_reader != (_func_int **)psVar1) {
    operator_delete(r.super_reader._vptr_reader);
  }
  argo::stream_reader::stream_reader(&r,(istream *)&f,1000,false);
  argo::parser::parser(&p,&r.super_reader,true,1000,9,true,(bool)in_R10B,true);
  argo::parser::parse((parser *)local_2298);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&jlog,"FAIL: nesting depth exceeded didn\'t cause exception\n",0x34);
  if (local_2298 != (undefined1  [8])0x0) {
    argo::json::~json((json *)local_2298);
    operator_delete((void *)local_2298);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&f);
  std::ios_base::~ios_base(local_21e0);
  return;
}

Assistant:

void test_options()
{
    // test message length limit
    {
        try
        {
            ifstream f("test_files/test2.json");
            stream_reader r(&f, 100, true);
            parser p(r);
            auto j = p.parse();
            jlog << "FAIL: message too long but parsed anyway\n";
        }
        catch (json_io_exception &e)
        {
            if (e.get_type() == json_exception::message_too_long_e)
            {
                jlog << "PASS: message too long threw correct exception type\n";
            }
            else
            {
                jlog << "FAIL: message too long threw incorrect exception type\n";
            }
        }
    }

    // test reading more than one message from file (in byte read mode)
    {
        try
        {
            ifstream f("test_files/test6.json");
            stream_reader r(&f, 1000, false);
            parser p(r, false);
            auto j1 = p.parse();
            if ((*j1)["one"] != 1)
            {
                jlog << "FAIL: first message broken\n";
            }
            auto j2 = p.parse();
            if ((*j2)["two"] != 2)
            {
                jlog << "FAIL: second message broken\n";
            }
            auto j3 = p.parse();
            if ((*j3)["three"] != 3)
            {
                jlog << "FAIL: third message broken\n";
            }
            jlog << "PASS: parsed three messages from file\n";
        }
        catch (exception &e)
        {
            jlog << "FAIL: failed to parse three messages from file : " << e.what() << endl;
        }
    }

    // test don't fallback to doubles for large ints
    {
        try
        {
            istringstream is("99999999999999999999");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 1000, true, false, true);
            auto j1 = p.parse();
            jlog << "FAIL: int that was too large to be an int didn't cause an exception\n";
        }
        catch (json_parser_exception &e)
        {
            if (e.get_type() == json_exception::number_out_of_range_e)
            {
                jlog << "PASS: int that was too large to be an int threw correct exception type\n";
            }
            else
            {
                jlog << "FAIL: int that was too large to be an int threw incorrect exception type\n";
            }
        }
    }

    // test don't convert numbers
    {
        try
        {
            istringstream is("99999999999999999999.99");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 1000, false, true, true);
            auto j1 = p.parse();
            if (j1->get_raw_value() == "99999999999999999999.99")
            {
                jlog << "PASS: don't convert number returned the correct raw value\n";
            }
            else
            {
                jlog << "FAIL: don't convert number returned an incorrect raw value\n";
            }
        }
        catch (json_parser_exception &e)
        {
            jlog << "FAIL: don't convert number threw an exception\n";
        }
    }

    // test don't convert strings
    {
        try
        {
            istringstream is("\" lkjlkj lkjlkj \\x \\y \"");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 1000, true, true, false);
            auto j1 = p.parse();
            if (j1->get_raw_value() == " lkjlkj lkjlkj \\x \\y ")
            {
                jlog << "PASS: don't convert string returned the correct raw value\n";
            }
            else
            {
                jlog << "FAIL: don't convert string returned an incorrect raw value:'" << j1->get_raw_value() << "'" << endl;
            }
        }
        catch (json_parser_exception &e)
        {
            jlog << "FAIL: don't convert string threw an exception\n";
        }
    }

    // test nesting depth limit
    {
        try
        {
            istringstream is("[[[[[[[[[[]]]]]]]]]]");
            stream_reader r(&is, 1000, false);
            parser p(r, true, 1000, 9, true, true, true);
            auto j1 = p.parse();
            jlog << "FAIL: nesting depth exceeded didn't cause exception\n";
        }
        catch (json_parser_exception &e)
        {
            if (e.get_type() == json_exception::maximum_nesting_depth_exceeded_e)
            {
                jlog << "PASS: message nested too deeply threw correct exception type\n";
            }
            else
            {
                jlog << "FAIL: message nested too deeply threw incorrect exception type\n";
            }
        }
    }
}